

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.cc
# Opt level: O1

bool xt::seq::contains(Seq *s,Object *o)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  double local_38;
  
  peVar1 = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  do {
    bVar2 = peVar1 != (element_type *)0x0;
    if (!bVar2) {
      return bVar2;
    }
    (**peVar1->_vptr_ISeq)(&local_48);
    if (((Type)local_48 == o->type) &&
       (p_Stack_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)o->typeinfo)) {
      if ((local_38 == (o->field_2).number) && (!NAN(local_38) && !NAN((o->field_2).number))) {
        return bVar2;
      }
    }
    (*((s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ISeq[1])
              (&local_48);
    p_Var3 = p_Stack_40;
    peVar1 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
    (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    peVar1 = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  } while( true );
}

Assistant:

bool contains(Seq s, Object o) {
	while (s) {
		if (s->first() == o) return true;
		s = s->next();
	}
	return false;
}